

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-cpu.c
# Opt level: O3

thread_ret_t ggml_graph_compute_secondary_thread(void *data)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  pthread_mutex_t *__mutex;
  pthread_mutex_t *__mutex_00;
  long lVar4;
  ulong uVar5;
  byte bVar6;
  ggml_threadpool *threadpool;
  
  __mutex = *(pthread_mutex_t **)((long)data + 0x210);
  ggml_thread_apply_priority(*(int32_t *)((long)__mutex + 0x120));
  if (*(char *)((long)data + 8) == '\0') {
    uVar5 = 0xffffffffffffffff;
    do {
      if (uVar5 == 0x1fe) goto LAB_0011021c;
      lVar4 = uVar5 + 10;
      uVar5 = uVar5 + 1;
    } while (*(char *)((long)data + lVar4) != '\x01');
    if (0x1fe < uVar5) goto LAB_0011021c;
  }
  ggml_thread_apply_affinity((_Bool *)((long)data + 8));
LAB_0011021c:
  do {
    while ((*(byte *)((long)__mutex + 0x105) & 1) != 0) {
      pthread_mutex_lock(__mutex);
      if ((*(byte *)((long)__mutex + 0x105) & 1) != 0) {
        pthread_cond_wait((pthread_cond_t *)(__mutex + 1),__mutex);
      }
      pthread_mutex_unlock(__mutex);
    }
    if ((*(byte *)((long)__mutex + 0x104) & 1) != 0) {
      return (thread_ret_t)0x0;
    }
    __mutex_00 = *(pthread_mutex_t **)((long)data + 0x210);
    bVar6 = *(byte *)((long)data + 0x20c);
    if ((*(int *)((long)data + 0x218) < *(int *)((long)__mutex_00 + 0x11c)) && ((bVar6 & 1) == 0)) {
      uVar1 = *(uint *)((long)__mutex_00 + 0x124);
      uVar5 = 0;
      while ((lVar4 = *(long *)((long)data + 0x210), (*(byte *)(lVar4 + 0x104) & 1) == 0 &&
             ((*(byte *)(lVar4 + 0x105) & 1) == 0))) {
        iVar2 = *(int *)(lVar4 + 0x68);
        if (iVar2 == *(int *)((long)data + 0x208)) {
          bVar6 = *(byte *)((long)data + 0x20c);
        }
        else {
          iVar3 = *(int *)(*(long *)((long)data + 0x210) + 0x11c);
          bVar6 = *(int *)((long)data + 0x218) < iVar3;
          *(bool *)((long)data + 0x20c) = *(int *)((long)data + 0x218) < iVar3;
          *(int *)((long)data + 0x208) = iVar2;
        }
        if ((((bVar6 & 1) != 0) || ((ulong)uVar1 << 0x11 <= uVar5)) ||
           (uVar5 = uVar5 + 1, *(char *)((long)data + 0x20c) == '\x01')) break;
      }
      bVar6 = *(byte *)((long)data + 0x20c);
    }
    if ((bVar6 & 1) == 0) {
      pthread_mutex_lock(__mutex_00);
      if (*(char *)((long)data + 0x20c) == '\0') {
        do {
          lVar4 = *(long *)((long)data + 0x210);
          if (((*(byte *)(lVar4 + 0x104) & 1) != 0) || ((*(byte *)(lVar4 + 0x105) & 1) != 0)) break;
          iVar2 = *(int *)(lVar4 + 0x68);
          if (iVar2 == *(int *)((long)data + 0x208)) {
            if ((*(byte *)((long)data + 0x20c) & 1) != 0) break;
          }
          else {
            iVar3 = *(int *)(*(long *)((long)data + 0x210) + 0x11c);
            *(bool *)((long)data + 0x20c) = *(int *)((long)data + 0x218) < iVar3;
            *(int *)((long)data + 0x208) = iVar2;
            if (*(int *)((long)data + 0x218) < iVar3) break;
          }
          pthread_cond_wait((pthread_cond_t *)(__mutex_00 + 1),__mutex_00);
        } while (*(char *)((long)data + 0x20c) != '\x01');
      }
      pthread_mutex_unlock(__mutex_00);
    }
    if (*(char *)((long)data + 0x20c) == '\x01') {
      *(undefined1 *)((long)data + 0x20c) = 0;
      ggml_graph_compute_thread(data);
    }
  } while( true );
}

Assistant:

static thread_ret_t ggml_graph_compute_secondary_thread(void* data) {
    struct ggml_compute_state * state = (struct ggml_compute_state *) data;
    struct ggml_threadpool * threadpool = state->threadpool;

    ggml_thread_apply_priority(threadpool->prio);
    if (ggml_thread_cpumask_is_valid(state->cpumask)) {
        ggml_thread_apply_affinity(state->cpumask);
    }

    while (true) {
        // Check if we need to sleep
        while (threadpool->pause) {
            GGML_PRINT_DEBUG("thread #%d inside pause loop\n", state->ith);
            ggml_mutex_lock_shared(&threadpool->mutex);
            if (threadpool->pause) {
                ggml_cond_wait(&threadpool->cond, &threadpool->mutex);
            }
            GGML_PRINT_DEBUG("thread #%d resuming after wait\n", state->ith);
            ggml_mutex_unlock_shared(&threadpool->mutex);
        }

        // This needs to be checked for after the cond_wait
        if (threadpool->stop) break;

        // Check if there is new work
        // The main thread is the only one that can dispatch new work

        ggml_graph_compute_check_for_work(state);
        if (state->pending) {
            state->pending = false;

            ggml_graph_compute_thread(state);
        }
    }

    return (thread_ret_t) 0;
}